

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragDepthTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FragDepthWriteCase::~FragDepthWriteCase(FragDepthWriteCase *this)

{
  ~FragDepthWriteCase(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

FragDepthWriteCase::~FragDepthWriteCase (void)
{
}